

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_compress_status_t
lzham::lzham_lib_compress_memory
          (lzham_compress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint32 uVar4;
  lzcompressor *this;
  byte_vec *this_00;
  uchar *__src;
  long in_RCX;
  ulong *in_RDX;
  void *in_RSI;
  long in_RDI;
  ulong in_R8;
  uint32 *in_R9;
  size_t dst_buf_size;
  byte_vec *comp_data;
  lzcompressor *pCompressor;
  task_pool *pTP;
  lzham_compress_status_t status;
  init_params params;
  lzham_compress_params *in_stack_ffffffffffffff70;
  init_params *in_stack_ffffffffffffff78;
  ulong uVar5;
  task_pool *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  compression_level in_stack_ffffffffffffffac;
  lzham_compress_status_t local_4;
  
  if ((in_RDI == 0) || (in_RDX == (ulong *)0x0)) {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  else if ((in_R8 == 0) || (in_RCX != 0)) {
    if (in_R8 < 0x100000000) {
      lzcompressor::init_params::init_params((init_params *)&stack0xffffffffffffffa0);
      local_4 = create_init_params(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (local_4 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        if (in_stack_ffffffffffffffa8 != 0) {
          in_stack_ffffffffffffffa0 = lzham_new<lzham::task_pool>();
          uVar2 = task_pool::init(in_stack_ffffffffffffffa0,
                                  (EVP_PKEY_CTX *)(ulong)in_stack_ffffffffffffffa8);
          if ((uVar2 & 1) == 0) {
            return LZHAM_COMP_STATUS_FAILED;
          }
        }
        this = lzham_new<lzham::lzcompressor>();
        if (this == (lzcompressor *)0x0) {
          lzham_delete<lzham::task_pool>((task_pool *)0x117d65);
          local_4 = LZHAM_COMP_STATUS_FAILED;
        }
        else {
          uVar2 = lzcompressor::init(this,(EVP_PKEY_CTX *)&stack0xffffffffffffffa0);
          if ((uVar2 & 1) == 0) {
            lzham_delete<lzham::task_pool>((task_pool *)0x117d92);
            lzham_delete<lzham::lzcompressor>((lzcompressor *)0x117d9c);
            local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
          }
          else if ((in_R8 == 0) ||
                  (bVar1 = lzcompressor::put_bytes
                                     ((lzcompressor *)
                                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                      in_stack_ffffffffffffffa0,local_4), bVar1)) {
            bVar1 = lzcompressor::put_bytes
                              ((lzcompressor *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               in_stack_ffffffffffffffa0,local_4);
            if (bVar1) {
              this_00 = lzcompressor::get_compressed_data(this);
              uVar5 = *in_RDX;
              uVar3 = vector<unsigned_char>::size(this_00);
              *in_RDX = (ulong)uVar3;
              if (in_R9 != (uint32 *)0x0) {
                uVar4 = lzcompressor::get_src_adler32(this);
                *in_R9 = uVar4;
              }
              uVar3 = vector<unsigned_char>::size(this_00);
              if (uVar5 < uVar3) {
                lzham_delete<lzham::task_pool>((task_pool *)0x117eae);
                lzham_delete<lzham::lzcompressor>((lzcompressor *)0x117eb8);
                local_4 = LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
              }
              else {
                __src = vector<unsigned_char>::get_ptr(this_00);
                uVar3 = vector<unsigned_char>::size(this_00);
                memcpy(in_RSI,__src,(ulong)uVar3);
                lzham_delete<lzham::task_pool>((task_pool *)0x117f06);
                lzham_delete<lzham::lzcompressor>((lzcompressor *)0x117f10);
                local_4 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
              }
            }
            else {
              *in_RDX = 0;
              lzham_delete<lzham::task_pool>((task_pool *)0x117e2a);
              lzham_delete<lzham::lzcompressor>((lzcompressor *)0x117e34);
              local_4 = LZHAM_COMP_STATUS_FAILED;
            }
          }
          else {
            *in_RDX = 0;
            lzham_delete<lzham::task_pool>((task_pool *)0x117de4);
            lzham_delete<lzham::lzcompressor>((lzcompressor *)0x117dee);
            local_4 = LZHAM_COMP_STATUS_FAILED;
          }
        }
      }
    }
    else {
      local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
    }
  }
  else {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  return local_4;
}

Assistant:

lzham_compress_status_t lzham_lib_compress_memory(const lzham_compress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if ((!pParams) || (!pDst_len))
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;

      if (src_len)
      {
         if (!pSrc_buf)
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (sizeof(size_t) > sizeof(uint32))
      {
         if (src_len > UINT32_MAX)
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      lzcompressor::init_params params;
      lzham_compress_status_t status = create_init_params(params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
         return status;

      task_pool *pTP = NULL;
      if (params.m_max_helper_threads)
      {
         pTP = lzham_new<task_pool>();
         if (!pTP->init(params.m_max_helper_threads))   
            return LZHAM_COMP_STATUS_FAILED;

         params.m_pTask_pool = pTP;
      }

      lzcompressor *pCompressor = lzham_new<lzcompressor>();
      if (!pCompressor)
      {
         lzham_delete(pTP);
         return LZHAM_COMP_STATUS_FAILED;
      }
      
      if (!pCompressor->init(params))
      {
         lzham_delete(pTP);
         lzham_delete(pCompressor);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (src_len)
      {
         if (!pCompressor->put_bytes(pSrc_buf, static_cast<uint32>(src_len)))
         {
            *pDst_len = 0;
            lzham_delete(pTP);
            lzham_delete(pCompressor);
            return LZHAM_COMP_STATUS_FAILED;
         }
      }

      if (!pCompressor->put_bytes(NULL, 0))
      {
         *pDst_len = 0;
         lzham_delete(pTP);
         lzham_delete(pCompressor);
         return LZHAM_COMP_STATUS_FAILED;
      }

      const byte_vec &comp_data = pCompressor->get_compressed_data();

      size_t dst_buf_size = *pDst_len;
      *pDst_len = comp_data.size();

      if (pAdler32)
         *pAdler32 = pCompressor->get_src_adler32();

      if (comp_data.size() > dst_buf_size)
      {
         lzham_delete(pTP);
         lzham_delete(pCompressor);
         return LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
      }

      memcpy(pDst_buf, comp_data.get_ptr(), comp_data.size());

      lzham_delete(pTP);
      lzham_delete(pCompressor);
      return LZHAM_COMP_STATUS_SUCCESS;  
   }